

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

void move_pos(lzma_mf *mf)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  uVar4 = mf->cyclic_pos + 1;
  uVar7 = 0;
  if (uVar4 != mf->cyclic_size) {
    uVar7 = uVar4;
  }
  mf->cyclic_pos = uVar7;
  uVar3 = mf->read_pos + 1;
  mf->read_pos = uVar3;
  if (mf->write_pos < uVar3) {
    __assert_fail("mf->read_pos <= mf->write_pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                  ,0xa2,"void move_pos(lzma_mf *)");
  }
  if (uVar3 + mf->offset != -1) {
    return;
  }
  uVar7 = mf->offset;
  if (mf->read_pos + uVar7 == -1) {
    uVar3 = ~mf->cyclic_size;
    uVar5 = mf->sons_count + mf->hash_size_sum;
    if (uVar5 != 0) {
      puVar2 = mf->hash;
      uVar6 = 0;
      do {
        uVar1 = puVar2[uVar6];
        uVar7 = uVar1 - uVar3;
        if (uVar1 < uVar3) {
          uVar7 = 0;
        }
        puVar2[uVar6] = uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar7 = mf->offset;
    }
    mf->offset = uVar7 - uVar3;
    return;
  }
  __assert_fail("mf->read_pos + mf->offset == MUST_NORMALIZE_POS",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x78,"void normalize(lzma_mf *)");
}

Assistant:

static void
move_pos(lzma_mf *mf)
{
	if (++mf->cyclic_pos == mf->cyclic_size)
		mf->cyclic_pos = 0;

	++mf->read_pos;
	assert(mf->read_pos <= mf->write_pos);

	if (unlikely(mf->read_pos + mf->offset == UINT32_MAX))
		normalize(mf);
}